

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O0

RTPAddress * __thiscall
jrtplib::RTPIPv6Address::CreateCopy(RTPIPv6Address *this,RTPMemoryManager *mgr)

{
  RTPIPv6Address *this_00;
  RTPIPv6Address *newaddr;
  RTPMemoryManager *mgr_local;
  RTPIPv6Address *this_local;
  
  this_00 = (RTPIPv6Address *)operator_new(0x20,mgr,0x17);
  RTPIPv6Address(this_00,(in6_addr)
                         *(anon_union_16_3_a3f0114d_for___in6_u *)
                          &(this->super_RTPAddress).field_0xc,this->port);
  return &this_00->super_RTPAddress;
}

Assistant:

RTPAddress *RTPIPv6Address::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPIPv6Address *newaddr = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(ip,port);
	return newaddr;
}